

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
NormalMutexTest_TryLockFail_Test<yamc::checked::mutex>::~NormalMutexTest_TryLockFail_Test
          (NormalMutexTest_TryLockFail_Test<yamc::checked::mutex> *this)

{
  NormalMutexTest_TryLockFail_Test<yamc::checked::mutex> *this_local;
  
  ~NormalMutexTest_TryLockFail_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(NormalMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}